

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::
argument_loader<kratos::FSMState*,std::shared_ptr<kratos::Var>const&,std::shared_ptr<kratos::Var>const&>
::load_impl_sequence<0ul,1ul,2ul>
          (argument_loader<kratos::FSMState*,std::shared_ptr<kratos::Var>const&,std::shared_ptr<kratos::Var>const&>
           *this,long call)

{
  bool bVar1;
  
  bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x50),(PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  if (bVar1) {
    bVar1 = type_caster_generic::
            load_impl<pybind11::detail::copyable_holder_caster<kratos::Var,std::shared_ptr<kratos::Var>,void>>
                      ((type_caster_generic *)(this + 0x28),*(PyObject **)(*(long *)(call + 8) + 8),
                       SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
    if (bVar1) {
      bVar1 = type_caster_generic::
              load_impl<pybind11::detail::copyable_holder_caster<kratos::Var,std::shared_ptr<kratos::Var>,void>>
                        ((type_caster_generic *)this,*(PyObject **)(*(long *)(call + 8) + 0x10),
                         SUB41((**(uint **)(call + 0x20) & 4) >> 2,0));
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }